

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O3

void __thiscall QFont::detach(QFont *this)

{
  QFontEngineData *pQVar1;
  QFontPrivate *pQVar2;
  QFontPrivate *pQVar3;
  
  pQVar3 = (this->d).d.ptr;
  if ((__int_type)
      (pQVar3->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int> == 1) {
    pQVar1 = pQVar3->engineData;
    if (pQVar1 != (QFontEngineData *)0x0) {
      LOCK();
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)
            (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
            super___atomic_base<int> + -1);
      UNLOCK();
      pQVar3 = (this->d).d.ptr;
      if ((__int_type)
          (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int> == 0) {
        pQVar1 = pQVar3->engineData;
        if (pQVar1 != (QFontEngineData *)0x0) {
          QFontEngineData::~QFontEngineData(pQVar1);
        }
        operator_delete(pQVar1,0x568);
        pQVar3 = (this->d).d.ptr;
      }
    }
    pQVar3->engineData = (QFontEngineData *)0x0;
    pQVar2 = pQVar3->scFont;
    if (pQVar2 != pQVar3 && pQVar2 != (QFontPrivate *)0x0) {
      LOCK();
      (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      pQVar3 = (this->d).d.ptr;
      if ((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i == 0) {
        pQVar3 = pQVar3->scFont;
        if (pQVar3 != (QFontPrivate *)0x0) {
          QFontPrivate::~QFontPrivate(pQVar3);
        }
        operator_delete(pQVar3,0x98);
        pQVar3 = (this->d).d.ptr;
      }
    }
    pQVar3->scFont = (QFontPrivate *)0x0;
  }
  else if ((__int_type)
           (pQVar3->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int> != 1) {
    QExplicitlySharedDataPointer<QFontPrivate>::detach_helper(&this->d);
    return;
  }
  return;
}

Assistant:

void QFont::detach()
{
    if (d->ref.loadRelaxed() == 1) {
        if (d->engineData && !d->engineData->ref.deref())
            delete d->engineData;
        d->engineData = nullptr;
        if (d->scFont && d->scFont != d.data()) {
            if (!d->scFont->ref.deref())
                delete d->scFont;
        }
        d->scFont = nullptr;
        return;
    }

    d.detach();
}